

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void google::protobuf::EnumValueOptions::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  EnumValueOptions **v1;
  EnumValueOptions **v2;
  char *failure_msg;
  LogMessage *pLVar2;
  RepeatedPtrField<google::protobuf::UninterpretedOption> *this;
  RepeatedPtrField<google::protobuf::UninterpretedOption> *other;
  uint32_t *puVar3;
  FeatureSet *pFVar4;
  FieldOptions_FeatureSupport *pFVar5;
  anon_union_80_1_493b367e_for_EnumValueOptions_3 *this_00;
  EnumValueOptions *extendee;
  LogMessage local_b8;
  Voidify local_a2;
  byte local_a1;
  LogMessage local_a0;
  Voidify local_89;
  uint local_88;
  uint32_t cached_has_bits;
  LogMessage local_78;
  Voidify local_61;
  EnumValueOptions *local_60;
  Nullable<const_char_*> local_58;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  Arena *arena;
  EnumValueOptions *from;
  EnumValueOptions *_this;
  MessageLite *from_msg_local;
  MessageLite *to_msg_local;
  Nullable<const_char_*> local_20;
  CleanupNode *local_18;
  Nullable<const_char_*> local_10;
  
  arena = (Arena *)from_msg;
  from = (EnumValueOptions *)to_msg;
  _this = (EnumValueOptions *)from_msg;
  from_msg_local = to_msg;
  absl_log_internal_check_op_result = (Nullable<const_char_*>)MessageLite::GetArena(to_msg);
  local_60 = (EnumValueOptions *)arena;
  v1 = absl::lts_20250127::log_internal::
       GetReferenceableValue<google::protobuf::EnumValueOptions_const*>(&local_60);
  v2 = absl::lts_20250127::log_internal::GetReferenceableValue<google::protobuf::EnumValueOptions*>
                 (&from);
  local_58 = absl::lts_20250127::log_internal::
             Check_NEImpl<google::protobuf::EnumValueOptions_const*,google::protobuf::EnumValueOptions*>
                       (v1,v2,"&from != _this");
  if (local_58 != (Nullable<const_char_*>)0x0) {
    failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_58);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_78,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.cc"
               ,0x2d4f,failure_msg);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_78);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_61,pLVar2);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_78);
  }
  local_88 = 0;
  this = _internal_mutable_uninterpreted_option(from);
  other = _internal_uninterpreted_option((EnumValueOptions *)arena);
  RepeatedPtrField<google::protobuf::UninterpretedOption>::MergeFrom(this,other);
  puVar3 = internal::HasBits<1>::operator[]((HasBits<1> *)&(arena->impl_).first_owner_,0);
  local_88 = *puVar3;
  if ((local_88 & 0xf) != 0) {
    if ((local_88 & 1) != 0) {
      local_a1 = 0;
      if ((arena->impl_).first_arena_.cleanup_list_.head_ == (Chunk *)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_a0,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.cc"
                   ,0x2d58,"from._impl_.features_ != nullptr");
        local_a1 = 1;
        pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_a0);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_89,pLVar2);
      }
      if ((local_a1 & 1) != 0) {
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_a0);
      }
      if ((from->field_0)._impl_.features_ == (FeatureSet *)0x0) {
        to_msg_local = (MessageLite *)(arena->impl_).first_arena_.cleanup_list_.head_;
        local_20 = absl_log_internal_check_op_result;
        pFVar4 = (FeatureSet *)
                 Arena::CopyConstruct<google::protobuf::FeatureSet>
                           ((Arena *)absl_log_internal_check_op_result,to_msg_local);
        (from->field_0)._impl_.features_ = pFVar4;
      }
      else {
        FeatureSet::MergeFrom
                  ((from->field_0)._impl_.features_,
                   (FeatureSet *)(arena->impl_).first_arena_.cleanup_list_.head_);
      }
    }
    if ((local_88 & 2) != 0) {
      if ((arena->impl_).first_arena_.cleanup_list_.next_ == (CleanupNode *)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_b8,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.cc"
                   ,0x2d60,"from._impl_.feature_support_ != nullptr");
        pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_b8);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_a2,pLVar2);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_b8);
      }
      if ((from->field_0)._impl_.feature_support_ == (FieldOptions_FeatureSupport *)0x0) {
        local_18 = (arena->impl_).first_arena_.cleanup_list_.next_;
        local_10 = absl_log_internal_check_op_result;
        pFVar5 = (FieldOptions_FeatureSupport *)
                 Arena::CopyConstruct<google::protobuf::FieldOptions_FeatureSupport>
                           ((Arena *)absl_log_internal_check_op_result,local_18);
        (from->field_0)._impl_.feature_support_ = pFVar5;
      }
      else {
        FieldOptions_FeatureSupport::MergeFrom
                  ((from->field_0)._impl_.feature_support_,
                   (FieldOptions_FeatureSupport *)(arena->impl_).first_arena_.cleanup_list_.next_);
      }
    }
    if ((local_88 & 4) != 0) {
      (from->field_0)._impl_.deprecated_ =
           (bool)(*(byte *)&(arena->impl_).first_arena_.cleanup_list_.limit_ & 1);
    }
    if ((local_88 & 8) != 0) {
      (from->field_0)._impl_.debug_redact_ =
           (bool)(*(byte *)((long)&(arena->impl_).first_arena_.cleanup_list_.limit_ + 1) & 1);
    }
  }
  uVar1 = local_88;
  puVar3 = internal::HasBits<1>::operator[](&(from->field_0)._impl_._has_bits_,0);
  *puVar3 = uVar1 | *puVar3;
  this_00 = &from->field_0;
  extendee = default_instance();
  internal::ExtensionSet::MergeFrom
            (&(this_00->_impl_)._extensions_,(MessageLite *)extendee,
             (ExtensionSet *)&(arena->impl_).field_0x10);
  internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
            (&(from->super_Message).super_MessageLite._internal_metadata_,
             (InternalMetadata *)&(arena->impl_).alloc_policy_);
  return;
}

Assistant:

void EnumValueOptions::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<EnumValueOptions*>(&to_msg);
  auto& from = static_cast<const EnumValueOptions&>(from_msg);
  ::google::protobuf::Arena* arena = _this->GetArena();
  // @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.EnumValueOptions)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_internal_mutable_uninterpreted_option()->MergeFrom(
      from._internal_uninterpreted_option());
  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x0000000fu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      ABSL_DCHECK(from._impl_.features_ != nullptr);
      if (_this->_impl_.features_ == nullptr) {
        _this->_impl_.features_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.features_);
      } else {
        _this->_impl_.features_->MergeFrom(*from._impl_.features_);
      }
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      ABSL_DCHECK(from._impl_.feature_support_ != nullptr);
      if (_this->_impl_.feature_support_ == nullptr) {
        _this->_impl_.feature_support_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.feature_support_);
      } else {
        _this->_impl_.feature_support_->MergeFrom(*from._impl_.feature_support_);
      }
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      _this->_impl_.deprecated_ = from._impl_.deprecated_;
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      _this->_impl_.debug_redact_ = from._impl_.debug_redact_;
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_impl_._extensions_.MergeFrom(&default_instance(), from._impl_._extensions_);
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}